

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O1

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::
handle_pre_init(connection<websocketpp::config::asio::transport_config> *this,init_handler *callback
               ,error_code *ec)

{
  _Atomic_word *p_Var1;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  size_t in_RCX;
  weak_ptr<void> local_78;
  _Any_data local_68;
  code *local_58;
  _Any_data local_48;
  code *local_38;
  
  this_00 = (this->m_alog).
            super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if ((this_00->m_static_channels & 0x400) != 0) {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (this_00,0x400,"asio connection handle pre_init",in_RCX);
  }
  if ((this->m_tcp_pre_init_handler).super__Function_base._M_manager != (_Manager_type)0x0) {
    p_Var2 = (this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
    local_78.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_78.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->m_connection_hdl).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
      }
    }
    if ((this->m_tcp_pre_init_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->m_tcp_pre_init_handler)._M_invoker)
              ((_Any_data *)&this->m_tcp_pre_init_handler,&local_78);
    if (local_78.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_78.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                  _M_weak_count;
        iVar3 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar3 = (local_78.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_weak_count;
        (local_78.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_weak_count = iVar3 + -1;
      }
      if (iVar3 == 1) {
        (*(local_78.super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base[3])();
      }
    }
  }
  if (ec->_M_value != 0) {
    if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*callback->_M_invoker)((_Any_data *)callback,ec);
  }
  if ((this->m_proxy)._M_string_length == 0) {
    std::function<void_(const_std::error_code_&)>::function
              ((function<void_(const_std::error_code_&)> *)&local_68,callback);
    post_init(this,(init_handler *)&local_68);
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
  }
  else {
    std::function<void_(const_std::error_code_&)>::function
              ((function<void_(const_std::error_code_&)> *)&local_48,callback);
    proxy_write(this,(init_handler *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
  }
  return;
}

Assistant:

void handle_pre_init(init_handler callback, lib::error_code const & ec) {
        if (m_alog->static_test(log::alevel::devel)) {
            m_alog->write(log::alevel::devel,"asio connection handle pre_init");
        }

        if (m_tcp_pre_init_handler) {
            m_tcp_pre_init_handler(m_connection_hdl);
        }

        if (ec) {
            callback(ec);
        }

        // If we have a proxy set issue a proxy connect, otherwise skip to
        // post_init
        if (!m_proxy.empty()) {
            proxy_write(callback);
        } else {
            post_init(callback);
        }
    }